

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

void tinyusdz::(anonymous_namespace)::_DecodeNHelper<1,int*>
               (char **codesIn,char **vintsIn,value_type_conflict6 commonValue,type *prevVal,
               int **output)

{
  byte bVar1;
  type tVar2;
  byte *pbVar3;
  type *ptVar4;
  char cVar5;
  short sVar6;
  int iVar7;
  int local_38;
  int i;
  uint8_t codeByte;
  int **output_local;
  type *prevVal_local;
  value_type_conflict6 commonValue_local;
  char **vintsIn_local;
  char **codesIn_local;
  
  pbVar3 = (byte *)*codesIn;
  *codesIn = (char *)(pbVar3 + 1);
  bVar1 = *pbVar3;
  for (local_38 = 0; local_38 != 1; local_38 = local_38 + 1) {
    switch(((uint)bVar1 & 3 << ((char)local_38 * '\x02' & 0x1fU)) >>
           ((char)local_38 * '\x02' & 0x1fU)) {
    default:
      *prevVal = commonValue + *prevVal;
      break;
    case 1:
      cVar5 = anon_unknown_0::_ReadBits<signed_char>(vintsIn);
      *prevVal = (int)cVar5 + *prevVal;
      break;
    case 2:
      sVar6 = anon_unknown_0::_ReadBits<short>(vintsIn);
      *prevVal = (int)sVar6 + *prevVal;
      break;
    case 3:
      iVar7 = anon_unknown_0::_ReadBits<int>(vintsIn);
      *prevVal = iVar7 + *prevVal;
    }
    tVar2 = *prevVal;
    ptVar4 = *output;
    *output = ptVar4 + 1;
    *ptVar4 = tVar2;
  }
  return;
}

Assistant:

void _DecodeNHelper(
    char const *&codesIn,
    char const *&vintsIn,
    typename std::iterator_traits<Iterator>::value_type commonValue,
    typename std::make_signed<
        typename std::iterator_traits<Iterator>::value_type
    >::type &prevVal,
    Iterator &output)
{
    using Int = typename std::iterator_traits<Iterator>::value_type;
    using SInt = typename std::make_signed<Int>::type;
    using SmallInt = typename _SmallTypes<Int>::SmallInt;
    using MediumInt = typename _SmallTypes<Int>::MediumInt;

    enum Code { Common, Small, Medium, Large };

    uint8_t codeByte = *codesIn++;
    for (int i = 0; i != N; ++i) {
        switch ((codeByte & (3 << (2 * i))) >> (2 * i)) {
        default:
        case Common:
            prevVal += commonValue;
            break;
        case Small:
            prevVal += _ReadBits<SmallInt>(vintsIn);
            break;
        case Medium:
            prevVal += _ReadBits<MediumInt>(vintsIn);
            break;
        case Large:
            prevVal += _ReadBits<SInt>(vintsIn);
            break;
        }
        *output++ = static_cast<Int>(prevVal);
    }
}